

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_zip.cpp
# Opt level: O1

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::ListZipBind(duckdb *this,ClientContext *context,ScalarFunction *bound_function,
                   vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                   *arguments)

{
  shared_ptr<duckdb::ExtraTypeInfo,_true> *psVar1;
  LogicalTypeId LVar2;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_> uVar4;
  undefined1 auVar5 [8];
  element_type *peVar6;
  undefined8 uVar7;
  __uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_> _Var8;
  reference pvVar9;
  pointer pEVar10;
  LogicalType *__y;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  undefined8 *puVar12;
  ParameterNotResolvedException *this_01;
  BinderException *pBVar13;
  pointer *__ptr;
  size_type sVar14;
  _Alloc_hider _Var15;
  long lVar16;
  size_type sVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  child_list_t<LogicalType> struct_children;
  case_insensitive_set_t struct_names;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_148;
  ScalarFunction *local_140;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalTypeId>
  local_138;
  undefined1 local_110 [8];
  undefined8 local_108;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_100;
  LogicalType local_f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_d8;
  element_type *local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  local_b8;
  _Head_base<0UL,_duckdb::BoundCastData_*,_false> local_98;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  __uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_> local_88;
  child_list_t<LogicalType> local_80;
  undefined1 local_68 [32];
  float local_48;
  size_t local_40;
  __node_base_ptr p_Stack_38;
  
  local_b8.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b8.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lVar16 = (long)(arguments->
                 super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                 ).
                 super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(arguments->
                 super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                 ).
                 super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  local_140 = bound_function;
  local_98._M_head_impl = (BoundCastData *)context;
  local_88._M_t.
  super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>.
  super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl =
       (tuple<duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>)
       (tuple<duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>)this;
  if (lVar16 == 0) {
    pBVar13 = (BinderException *)__cxa_allocate_exception(0x10);
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68,
                     "Provide at least one argument to ",
                     &(local_140->super_BaseScalarFunction).super_SimpleFunction.super_Function.name
                    );
    BinderException::BinderException(pBVar13,(string *)local_68);
    __cxa_throw(pBVar13,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
  }
  sVar17 = lVar16 >> 3;
  sVar14 = sVar17 - 1;
  pvVar9 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::operator[](arguments,sVar14);
  pEVar10 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
            operator->(pvVar9);
  if (((pEVar10->return_type).id_ == BOOLEAN) && (sVar17 = sVar14, sVar14 == 0)) {
    pBVar13 = (BinderException *)__cxa_allocate_exception(0x10);
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68,
                     "Provide at least one list argument to ",
                     &(local_140->super_BaseScalarFunction).super_SimpleFunction.super_Function.name
                    );
    BinderException::BinderException(pBVar13,(string *)local_68);
    __cxa_throw(pBVar13,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
  }
  local_68._0_8_ = &p_Stack_38;
  local_68._8_8_ = 1;
  local_68._16_8_ = (_Hash_node_base *)0x0;
  local_68._24_8_ = 0;
  local_48 = 1.0;
  local_40 = 0;
  p_Stack_38 = (__node_base_ptr)0x0;
  if (sVar17 != 0) {
    sVar14 = 0;
    do {
      pvVar9 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
               ::operator[](arguments,sVar14);
      pEVar10 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                operator->(pvVar9);
      LVar2 = (pEVar10->return_type).id_;
      if (LVar2 < LIST) {
        if (LVar2 != SQLNULL) {
          if (LVar2 == UNKNOWN) {
            this_01 = (ParameterNotResolvedException *)__cxa_allocate_exception(0x10);
            ParameterNotResolvedException::ParameterNotResolvedException(this_01);
            __cxa_throw(this_01,&ParameterNotResolvedException::typeinfo,
                        ::std::runtime_error::~runtime_error);
          }
          goto LAB_00927e34;
        }
        local_d8 = &local_c8;
        local_138.first._M_dataplus._M_p = (pointer)&local_138.first.field_2;
        local_138.first.field_2._M_allocated_capacity =
             (ulong)(uint7)local_c8._M_allocated_capacity._1_7_ << 8;
        local_138.first.field_2._8_8_ = local_c8._8_8_;
        local_138.first._M_string_length = 0;
        local_d0 = (element_type *)0x0;
        local_c8._M_local_buf[0] = '\0';
        local_138.second = SQLNULL;
        ::std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
        ::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalTypeId,_true>
                  ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
                    *)local_110,&local_138);
        ::std::
        vector<std::pair<std::__cxx11::string,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string,duckdb::LogicalType>>>
        ::emplace_back<std::pair<std::__cxx11::string,duckdb::LogicalType>>
                  ((vector<std::pair<std::__cxx11::string,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string,duckdb::LogicalType>>>
                    *)&local_b8,
                   (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
                    *)local_110);
        LogicalType::~LogicalType(&local_f0);
        if (local_110 != (undefined1  [8])&aStack_100) {
          operator_delete((void *)local_110);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138.first._M_dataplus._M_p != &local_138.first.field_2) {
          operator_delete(local_138.first._M_dataplus._M_p);
        }
        paVar11 = &local_c8;
        _Var15._M_p = (pointer)local_d8;
      }
      else {
        if ((LVar2 != LIST) && (LVar2 != ARRAY)) {
LAB_00927e34:
          pBVar13 = (BinderException *)__cxa_allocate_exception(0x10);
          local_110 = (undefined1  [8])&aStack_100;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_110,"Parameter type needs to be List","");
          BinderException::BinderException(pBVar13,(string *)local_110);
          __cxa_throw(pBVar13,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
        }
        local_148._M_head_impl =
             (pvVar9->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
             )._M_t.
             super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
             _M_t.
             super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
             super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
        (pvVar9->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
        _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
        _M_t.super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
        super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
        BoundCastExpression::AddArrayCastToList
                  ((BoundCastExpression *)local_110,(ClientContext *)local_98._M_head_impl,
                   (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   &local_148);
        auVar5 = local_110;
        local_110 = (undefined1  [8])0x0;
        _Var3._M_head_impl =
             (pvVar9->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
             )._M_t.
             super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
             _M_t.
             super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
             super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
        (pvVar9->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
        _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
        _M_t.super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
        super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)auVar5;
        if (_Var3._M_head_impl != (Expression *)0x0) {
          (**(code **)(*(long *)&(_Var3._M_head_impl)->super_BaseExpression + 8))();
        }
        if (local_110 != (undefined1  [8])0x0) {
          (**(code **)(*(_func_int **)local_110 + 8))();
        }
        local_110 = (undefined1  [8])0x0;
        if (local_148._M_head_impl != (Expression *)0x0) {
          (*((local_148._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
        }
        local_148._M_head_impl = (Expression *)0x0;
        local_138.first._M_dataplus._M_p = (pointer)&local_138.first.field_2;
        local_138.first._M_string_length = 0;
        local_138.first.field_2._M_allocated_capacity =
             local_138.first.field_2._M_allocated_capacity & 0xffffffffffffff00;
        pEVar10 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                  operator->(pvVar9);
        __y = ListType::GetChildType(&pEVar10->return_type);
        ::std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
        ::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
                    *)local_110,&local_138.first,__y);
        ::std::
        vector<std::pair<std::__cxx11::string,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string,duckdb::LogicalType>>>
        ::emplace_back<std::pair<std::__cxx11::string,duckdb::LogicalType>>
                  ((vector<std::pair<std::__cxx11::string,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string,duckdb::LogicalType>>>
                    *)&local_b8,
                   (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
                    *)local_110);
        LogicalType::~LogicalType(&local_f0);
        if (local_110 != (undefined1  [8])&aStack_100) {
          operator_delete((void *)local_110);
        }
        paVar11 = &local_138.first.field_2;
        _Var15._M_p = local_138.first._M_dataplus._M_p;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var15._M_p != paVar11) {
        operator_delete(_Var15._M_p);
      }
      sVar14 = sVar14 + 1;
    } while (sVar17 != sVar14);
  }
  ::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
            *)&local_80,&local_b8);
  LogicalType::STRUCT((LogicalType *)&local_138,&local_80);
  LogicalType::LIST((LogicalType *)local_110,(LogicalType *)&local_138);
  uVar7 = aStack_100._M_allocated_capacity;
  peVar6 = local_108;
  (local_140->super_BaseScalarFunction).return_type.id_ = (LogicalTypeId)local_110[0];
  (local_140->super_BaseScalarFunction).return_type.physical_type_ = local_110[1];
  psVar1 = &(local_140->super_BaseScalarFunction).return_type.type_info_;
  uVar18 = *(undefined4 *)
            &(psVar1->internal).
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  uVar19 = *(undefined4 *)
            ((long)&(local_140->super_BaseScalarFunction).return_type.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 4
            );
  uVar4._M_t.
  super___uniq_ptr_impl<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::BoundCastData_*,_std::default_delete<duckdb::BoundCastData>_>.
  super__Head_base<0UL,_duckdb::BoundCastData_*,_false>._M_head_impl =
       (__uniq_ptr_data<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true,_true>
        )(psVar1->internal).super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr;
  uVar20 = *(undefined4 *)
            &(local_140->super_BaseScalarFunction).return_type.type_info_.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
  ;
  uVar21 = *(undefined4 *)
            ((long)&(local_140->super_BaseScalarFunction).return_type.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi + 4);
  (local_140->super_BaseScalarFunction).return_type.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
  ;
  (local_140->super_BaseScalarFunction).return_type.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_108 = (element_type *)0x0;
  aStack_100._M_allocated_capacity = 0;
  this_00 = (local_140->super_BaseScalarFunction).return_type.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (local_140->super_BaseScalarFunction).return_type.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar6;
  (local_140->super_BaseScalarFunction).return_type.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar7;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    local_98._M_head_impl =
         (BoundCastData *)
         uVar4._M_t.
         super___uniq_ptr_impl<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>.
         _M_t.
         super__Tuple_impl<0UL,_duckdb::BoundCastData_*,_std::default_delete<duckdb::BoundCastData>_>
         .super__Head_base<0UL,_duckdb::BoundCastData_*,_false>._M_head_impl;
    uStack_90 = uVar20;
    uStack_8c = uVar21;
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    uVar18 = local_98._M_head_impl._0_4_;
    uVar19 = local_98._M_head_impl._4_4_;
    uVar20 = uStack_90;
    uVar21 = uStack_8c;
  }
  uVar7 = aStack_100._M_allocated_capacity;
  local_108 = (element_type *)CONCAT44(uVar19,uVar18);
  aStack_100._M_allocated_capacity._4_4_ = uVar21;
  aStack_100._M_allocated_capacity._0_4_ = uVar20;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar7 !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar7);
  }
  LogicalType::~LogicalType((LogicalType *)local_110);
  LogicalType::~LogicalType((LogicalType *)&local_138);
  ::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
             *)&local_80);
  puVar12 = (undefined8 *)operator_new(0x20);
  LogicalType::LogicalType
            ((LogicalType *)local_110,&(local_140->super_BaseScalarFunction).return_type);
  *puVar12 = &PTR__VariableReturnBindData_019b2938;
  LogicalType::LogicalType((LogicalType *)(puVar12 + 1),(LogicalType *)local_110);
  LogicalType::~LogicalType((LogicalType *)local_110);
  _Var8._M_t.
  super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>.
  super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl =
       local_88._M_t.
       super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>.
       super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl;
  *(undefined8 **)
   local_88._M_t.
   super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>.
   super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl = puVar12;
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)local_68);
  ::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
             *)&local_b8);
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (_Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>)
         _Var8._M_t.
         super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>.
         super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl;
}

Assistant:

static unique_ptr<FunctionData> ListZipBind(ClientContext &context, ScalarFunction &bound_function,
                                            vector<unique_ptr<Expression>> &arguments) {
	child_list_t<LogicalType> struct_children;

	// The last argument could be a flag to be set if we want a minimal list or a maximal list
	idx_t size = arguments.size();
	if (size == 0) {
		throw BinderException("Provide at least one argument to " + bound_function.name);
	}
	if (arguments[size - 1]->return_type.id() == LogicalTypeId::BOOLEAN) {
		if (--size == 0) {
			throw BinderException("Provide at least one list argument to " + bound_function.name);
		}
	}

	case_insensitive_set_t struct_names;
	for (idx_t i = 0; i < size; i++) {
		auto &child = arguments[i];
		switch (child->return_type.id()) {
		case LogicalTypeId::LIST:
		case LogicalTypeId::ARRAY:
			child = BoundCastExpression::AddArrayCastToList(context, std::move(child));
			struct_children.push_back(make_pair(string(), ListType::GetChildType(child->return_type)));
			break;
		case LogicalTypeId::SQLNULL:
			struct_children.push_back(make_pair(string(), LogicalTypeId::SQLNULL));
			break;
		case LogicalTypeId::UNKNOWN:
			throw ParameterNotResolvedException();
		default:
			throw BinderException("Parameter type needs to be List");
		}
	}
	bound_function.return_type = LogicalType::LIST(LogicalType::STRUCT(struct_children));
	return make_uniq<VariableReturnBindData>(bound_function.return_type);
}